

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window,ImGuiFocusRequestFlags flags)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  uint in_ESI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *display_front_window;
  ImGuiWindow *focus_front_window;
  ImGuiWindow *blocking_modal;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffb0;
  ImGuiWindow *local_48;
  ImGuiID local_3c;
  char *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  ImGuiID focus_scope_id;
  ImGuiWindow *in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  ImGuiWindow *local_8;
  
  pIVar1 = GImGui;
  focus_scope_id = (ImGuiID)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (((in_ESI & 2) != 0) && (GImGui->NavWindow != in_RDI)) {
    pIVar2 = FindBlockingModal(in_stack_ffffffffffffffd8);
    if (pIVar2 != (ImGuiWindow *)0x0) {
      if ((pIVar1->DebugLogFlags & 2U) != 0) {
        if (in_RDI == (ImGuiWindow *)0x0) {
          local_38 = "<NULL>";
        }
        else {
          local_38 = in_RDI->Name;
        }
        DebugLog("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n",local_38,
                 pIVar2->Name);
      }
      if (((in_RDI != (ImGuiWindow *)0x0) && (in_RDI == in_RDI->RootWindow)) &&
         ((in_RDI->Flags & 0x2000U) == 0)) {
        BringWindowToDisplayBehind(pIVar2,in_stack_ffffffffffffffd8);
      }
      uVar3 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
      GetTopMostPopupModal();
      ClosePopupsOverWindow(pIVar2,(bool)uVar3);
      return;
    }
    in_stack_ffffffffffffffe0 = (ImGuiWindow *)0x0;
  }
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  local_8 = in_RDI;
  if (((in_ESI & 1) != 0) && (in_RDI != (ImGuiWindow *)0x0)) {
    local_8 = NavRestoreLastChildNavWindow(in_RDI);
  }
  if (pIVar1->NavWindow != local_8) {
    SetNavWindow(in_stack_ffffffffffffffb0);
    if ((local_8 != (ImGuiWindow *)0x0) && ((pIVar1->NavDisableMouseHover & 1U) != 0)) {
      pIVar1->NavMousePosDirty = true;
    }
    if (local_8 == (ImGuiWindow *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = local_8->NavLastIds[0];
    }
    pIVar1->NavId = local_3c;
    pIVar1->NavLayer = ImGuiNavLayer_Main;
    SetNavFocusScope(focus_scope_id);
    pIVar1->NavIdIsAlive = false;
    pIVar1->NavLastValidSelectionUserData = -1;
    ClosePopupsOverWindow(in_stack_ffffffffffffffe0,(bool)uVar3);
  }
  if (local_8 == (ImGuiWindow *)0x0) {
    local_48 = (ImGuiWindow *)0x0;
    pIVar2 = (ImGuiWindow *)0x0;
  }
  else {
    local_48 = local_8->RootWindow;
    pIVar2 = local_8->RootWindow;
  }
  if ((((pIVar1->ActiveId != 0) && (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (pIVar1->ActiveIdWindow->RootWindow != local_48)) &&
     ((pIVar1->ActiveIdNoClearOnFocusLoss & 1U) == 0)) {
    ClearActiveID();
  }
  if ((local_8 != (ImGuiWindow *)0x0) &&
     (BringWindowToFocusFront(pIVar2), ((local_8->Flags | pIVar2->Flags) & 0x2000U) == 0)) {
    BringWindowToDisplayFront(pIVar2);
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window, ImGuiFocusRequestFlags flags)
{
    ImGuiContext& g = *GImGui;

    // Modal check?
    if ((flags & ImGuiFocusRequestFlags_UnlessBelowModal) && (g.NavWindow != window)) // Early out in common case.
        if (ImGuiWindow* blocking_modal = FindBlockingModal(window))
        {
            // This block would typically be reached in two situations:
            // - API call to FocusWindow() with a window under a modal and ImGuiFocusRequestFlags_UnlessBelowModal flag.
            // - User clicking on void or anything behind a modal while a modal is open (window == NULL)
            IMGUI_DEBUG_LOG_FOCUS("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n", window ? window->Name : "<NULL>", blocking_modal->Name);
            if (window && window == window->RootWindow && (window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
                BringWindowToDisplayBehind(window, blocking_modal); // Still bring right under modal. (FIXME: Could move in focus list too?)
            ClosePopupsOverWindow(GetTopMostPopupModal(), false); // Note how we need to use GetTopMostPopupModal() aad NOT blocking_modal, to handle nested modals
            return;
        }

    // Find last focused child (if any) and focus it instead.
    if ((flags & ImGuiFocusRequestFlags_RestoreFocusedChild) && window != NULL)
        window = NavRestoreLastChildNavWindow(window);

    // Apply focus
    if (g.NavWindow != window)
    {
        SetNavWindow(window);
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavLayer = ImGuiNavLayer_Main;
        SetNavFocusScope(window ? window->NavRootFocusScopeId : 0);
        g.NavIdIsAlive = false;
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;

        // Close popups if any
        ClosePopupsOverWindow(window, false);
    }

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}